

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O2

iterator * __thiscall
google::protobuf::RepeatedFieldRef<google::protobuf::Message,_void>::begin
          (iterator *__return_storage_ptr__,RepeatedFieldRef<google::protobuf::Message,_void> *this)

{
  AccessorType *pAVar1;
  Message *pMVar2;
  void *pvVar3;
  
  pvVar3 = this->data_;
  pAVar1 = this->accessor_;
  pMVar2 = NewMessage(this);
  __return_storage_ptr__->data_ = pvVar3;
  __return_storage_ptr__->accessor_ = pAVar1;
  pvVar3 = (void *)(**(code **)(*(long *)pAVar1 + 0x48))(pAVar1,pvVar3);
  __return_storage_ptr__->iterator_ = pvVar3;
  (__return_storage_ptr__->scratch_space_)._M_t.
  super___uniq_ptr_impl<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>.
  _M_t.
  super__Tuple_impl<0UL,_google::protobuf::Message_*,_std::default_delete<google::protobuf::Message>_>
  .super__Head_base<0UL,_google::protobuf::Message_*,_false>._M_head_impl = pMVar2;
  return __return_storage_ptr__;
}

Assistant:

iterator begin() const {
    return iterator(data_, accessor_, true, NewMessage());
  }